

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void internal_start_create_script_window(Am_Value_List *commands_for_script,Am_Object *cmd)

{
  Am_Slot_Key key;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_String local_70;
  Am_Object local_68;
  Am_Object script_execute_command;
  Am_String local_58;
  Am_String name;
  Am_Object window;
  Am_Object sel_widget;
  Am_Object script_window;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object undo_db;
  Am_Object *cmd_local;
  Am_Value_List *commands_for_script_local;
  
  undo_db.data = (Am_Object_Data *)cmd;
  bVar1 = Am_Value_List::Empty(commands_for_script);
  if (!bVar1) {
    Am_Object::Get_Object(&local_28,(Am_Slot_Key)undo_db.data,0x170);
    pAVar2 = Am_Object::Get(&local_28,0x68,0);
    Am_Object::Am_Object(&local_20,pAVar2);
    Am_Object::~Am_Object(&local_28);
    get_script_window(&sel_widget);
    pAVar2 = Am_Object::Get(&local_20,0x197,0);
    Am_Object::Am_Object(&window,pAVar2);
    pAVar2 = Am_Object::Get(&window,0x68,0);
    Am_Object::Am_Object((Am_Object *)&name,pAVar2);
    gen_script_name();
    Am_Object::Get_Object(&script_execute_command,(Am_Slot_Key)&sel_widget,(ulong)Am_NAME_OBJECT);
    Am_Object::Set(&script_execute_command,0x169,&local_58,0);
    Am_Object::~Am_Object(&script_execute_command);
    Am_String::Am_String(&local_70,&local_58);
    create_script_execute_command
              (&local_68,(Am_Value_List *)&sel_widget,(Am_Object *)commands_for_script,
               (Am_Object *)&name,(Am_String *)&window);
    Am_String::~Am_String(&local_70);
    key = Am_SCRIPT_EXECUTE_COMMAND;
    value = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
    Am_Object::Set(&sel_widget,key,value,0);
    Am_Object::Set(&sel_widget,Am_SHOW_SCRIPT_COMMAND,0,0);
    am_set_commands_into_script_window(&sel_widget,&local_68);
    Am_Object::Set(&sel_widget,0x69,true,0);
    Am_Object::~Am_Object(&local_68);
    Am_String::~Am_String(&local_58);
    Am_Object::~Am_Object((Am_Object *)&name);
    Am_Object::~Am_Object(&window);
    Am_Object::~Am_Object(&sel_widget);
    Am_Object::~Am_Object(&local_20);
  }
  return;
}

Assistant:

void
internal_start_create_script_window(Am_Value_List &commands_for_script,
                                    Am_Object &cmd)
{
  if (!commands_for_script.Empty()) {
    Am_Object undo_db = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get(Am_WINDOW);
    Am_Object script_window = get_script_window(undo_db);

    Am_Object sel_widget = undo_db.Get(Am_SELECTION_WIDGET);
    Am_Object window = sel_widget.Get(Am_WINDOW);
    Am_String name = gen_script_name();
    script_window.Get_Object(Am_NAME_OBJECT).Set(Am_VALUE, name);
    Am_Object script_execute_command = create_script_execute_command(
        script_window, commands_for_script, window, sel_widget, name);
    script_window.Set(Am_SCRIPT_EXECUTE_COMMAND, script_execute_command);
    script_window.Set(Am_SHOW_SCRIPT_COMMAND, (0L));

    am_set_commands_into_script_window(script_window, script_execute_command);
    script_window.Set(Am_VISIBLE, true);
  }
}